

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

int graph_5_4::prim_5(m_graph g)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 *puVar9;
  undefined8 uStack_30;
  int iStack_28;
  undefined1 auStack_24 [4];
  
  iVar2 = g.vexs[8];
  uVar8 = (ulong)(uint)g.vexs[8];
  lVar3 = -(uVar8 * 4 + 0xf & 0xfffffffffffffff0);
  puVar9 = (undefined4 *)((long)&iStack_28 + lVar3);
  if (1 < g.vexs[8]) {
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x103e8f;
    memcpy(auStack_24 + lVar3,&stack0x0000000c,(ulong)(g.vexs[8] - 1) << 2);
  }
  *puVar9 = 0;
  lVar3 = 1;
  do {
    if (1 < iVar2) {
      uVar4 = 0;
      iVar5 = -1;
      uVar6 = 1;
      do {
        if ((puVar9[lVar3] != 0) && ((int)puVar9[uVar6] < iVar5)) {
          uVar4 = uVar6 & 0xffffffff;
          iVar5 = puVar9[uVar6];
        }
        puVar9[(int)uVar4] = 0;
        uVar7 = 1;
        do {
          if ((puVar9[uVar7] != 0) &&
             (iVar1 = g.arc[(long)(int)uVar4 + -1][uVar7 + 8], (int)puVar9[uVar7] < iVar1)) {
            puVar9[uVar7] = iVar1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar8);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int prim_5(m_graph g) {
        int dis[g.vnum], adjvex[g.vnum], min, j, k;
        for (int i = 1; i < g.vnum; i++) {
            dis[i] = g.arc[0][i];
            adjvex[i] = 0;
        }
        dis[0] = 0;
        adjvex[0] = 0;

        for (int i = 1; i < g.vnum; i++) {
            min = INTMAX_MAX, j = 1, k = 0;
            while (j < g.vnum) {
                if (dis[i] != 0 && dis[j] < min) {
                    min = dis[j];
                    k = j;
                }
                //visit(k);
                j++;
                dis[k] = 0;
                for (int p = 1; p < g.vnum; p++) {
                    if (dis[p] != 0 && dis[p] < g.arc[k][p]) {
                        dis[p] = g.arc[k][p];
                        adjvex[p] = k;
                    }
                }
            }
        }
    }